

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3_value_pointer(sqlite3_value *pVal,char *zPType)

{
  int iVar1;
  char *pcVar2;
  Mem *p;
  
  pcVar2 = (char *)0x0;
  if ((zPType != (char *)0x0) && ((pVal->flags & 0xc3df) == 0x8201)) {
    if ((pVal->eSubtype == 'p') && (iVar1 = strcmp((pVal->u).zPType,zPType), iVar1 == 0)) {
      pcVar2 = pVal->z;
    }
    else {
      pcVar2 = (char *)0x0;
    }
  }
  return pcVar2;
}

Assistant:

SQLITE_API void *sqlite3_value_pointer(sqlite3_value *pVal, const char *zPType){
  Mem *p = (Mem*)pVal;
  if( (p->flags&(MEM_TypeMask|MEM_Term|MEM_Subtype)) ==
                 (MEM_Null|MEM_Term|MEM_Subtype)
   && zPType!=0
   && p->eSubtype=='p'
   && strcmp(p->u.zPType, zPType)==0
  ){
    return (void*)p->z;
  }else{
    return 0;
  }
}